

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
MultiSigningProvider::GetKeyOrigin(MultiSigningProvider *this,CKeyID *keyid,KeyOriginInfo *info)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  undefined8 *puVar5;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *provider;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *(undefined8 **)&this->field_0x10;
  puVar3 = *(undefined8 **)&this->m_providers;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar2) break;
    cVar4 = (**(code **)(*(long *)*puVar5 + 0x38))((long *)*puVar5,keyid,info);
    puVar3 = puVar5 + 1;
  } while (cVar4 == '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return puVar5 != puVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MultiSigningProvider::GetKeyOrigin(const CKeyID& keyid, KeyOriginInfo& info) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetKeyOrigin(keyid, info)) return true;
    }
    return false;
}